

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

void duckdb::BitwiseXOROperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  value_type vVar4;
  value_type vVar5;
  anon_union_16_2_67f50693_for_value *paVar6;
  undefined8 uVar7;
  char *pcVar8;
  byte bVar9;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  string_t *psVar12;
  string_t *psVar13;
  UnifiedVectorFormat *pUVar14;
  UnifiedVectorFormat *pUVar15;
  long lVar16;
  undefined8 *puVar17;
  VectorType VVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  anon_union_16_2_67f50693_for_value aVar24;
  string_t target_7;
  string_t target;
  anon_union_16_2_67f50693_for_value local_148;
  Vector *local_130;
  long local_128;
  UnifiedVectorFormat *local_120;
  string_t *local_118;
  Vector *local_110;
  ulong *local_108;
  ulong local_100;
  string_t *local_f8;
  anon_union_16_2_67f50693_for_value local_f0;
  long local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  string_t *local_a8;
  string_t *local_a0;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  ulong local_60;
  undefined8 local_58;
  ulong local_50;
  ulong local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vVar4 = *vector;
  vVar5 = *vector_00;
  VVar18 = (VectorType)result;
  local_130 = result;
  if (((byte)vVar4 ^ 2) == 0 && ((byte)vVar5 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar18);
    psVar12 = *(string_t **)(vector_00 + 0x20);
    paVar6 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    result = local_130;
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      local_a8 = (string_t *)**(ulong **)(vector + 0x20);
      local_a0 = (string_t *)(*(ulong **)(vector + 0x20))[1];
      local_148._0_8_ = *(undefined8 *)&psVar12->value;
      local_148.pointer.ptr = (psVar12->value).pointer.ptr;
      local_f0 = (anon_union_16_2_67f50693_for_value)
                 duckdb::StringVector::EmptyString(local_130,(ulong)local_a8 & 0xffffffff);
      duckdb::Bit::BitwiseXor
                ((Bit *)&local_a8,(string_t *)&local_148.pointer,(string_t *)&local_f0.pointer,
                 psVar12);
      paVar6->pointer = (anon_struct_16_3_d7536bce_for_pointer)local_f0;
      return;
    }
  }
  else {
    pUVar14 = *(UnifiedVectorFormat **)(args + 0x18);
    local_120 = pUVar14;
    if (((byte)vVar5 ^ 2) == 0 && vVar4 == (value_type)0x0) {
      lVar23 = *(long *)(vector + 0x20);
      local_110 = *(Vector **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar18);
        local_128 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar14 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          uVar7 = *(undefined8 *)local_110;
          pcVar8 = *(char **)((long)local_110 + 8);
          lVar22 = 8;
          do {
            local_a8 = *(string_t **)(lVar23 + -8 + lVar22);
            psVar12 = *(string_t **)(lVar23 + lVar22);
            local_148._0_8_ = uVar7;
            local_148.pointer.ptr = pcVar8;
            local_a0 = psVar12;
            aVar24 = (anon_union_16_2_67f50693_for_value)
                     duckdb::StringVector::EmptyString(local_130,(ulong)local_a8 & 0xffffffff);
            local_f0 = aVar24;
            duckdb::Bit::BitwiseXor
                      ((Bit *)&local_a8,(string_t *)&local_148.pointer,(string_t *)&local_f0.pointer
                       ,psVar12);
            ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + lVar22))->pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)local_f0;
            lVar22 = lVar22 + 0x10;
            local_120 = local_120 + -1;
          } while (local_120 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar14 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        local_108 = (ulong *)((ulong)(pUVar14 + 0x3f) >> 6);
        local_100 = 0;
        pUVar14 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(local_130 + 0x28) == 0) {
            uVar19 = 0xffffffffffffffff;
          }
          else {
            uVar19 = *(ulong *)(*(long *)(local_130 + 0x28) + local_100 * 8);
          }
          pUVar10 = pUVar14 + 0x40;
          if (local_120 <= pUVar14 + 0x40) {
            pUVar10 = local_120;
          }
          pUVar15 = pUVar10;
          if (uVar19 != 0) {
            pUVar15 = pUVar14;
            if (uVar19 == 0xffffffffffffffff) {
              if (pUVar14 < pUVar10) {
                local_118 = *(string_t **)local_110;
                local_f8 = *(string_t **)((long)local_110 + 8);
                uVar19 = (long)pUVar14 << 4 | 8;
                do {
                  local_a8 = *(string_t **)(lVar23 + -8 + uVar19);
                  local_a0 = *(string_t **)(lVar23 + uVar19);
                  local_148._0_8_ = local_118;
                  local_148.pointer.ptr = (char *)local_f8;
                  psVar12 = local_f8;
                  aVar24 = (anon_union_16_2_67f50693_for_value)
                           duckdb::StringVector::EmptyString(local_130,(ulong)local_a8 & 0xffffffff)
                  ;
                  local_f0 = aVar24;
                  duckdb::Bit::BitwiseXor
                            ((Bit *)&local_a8,(string_t *)&local_148.pointer,
                             (string_t *)&local_f0.pointer,psVar12);
                  ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + uVar19))->pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)local_f0;
                  pUVar14 = pUVar14 + 1;
                  uVar19 = uVar19 + 0x10;
                  pUVar15 = pUVar14;
                } while (pUVar10 != pUVar14);
              }
            }
            else if (pUVar14 < pUVar10) {
              uVar20 = (long)pUVar14 << 4 | 8;
              uVar21 = 0;
              do {
                if ((uVar19 >> (uVar21 & 0x3f) & 1) != 0) {
                  local_a8 = *(string_t **)(lVar23 + -8 + uVar20);
                  psVar12 = *(string_t **)(lVar23 + uVar20);
                  local_148._0_8_ = *(undefined8 *)local_110;
                  local_148.pointer.ptr = (char *)*(undefined8 *)((long)local_110 + 8);
                  local_a0 = psVar12;
                  aVar24 = (anon_union_16_2_67f50693_for_value)
                           duckdb::StringVector::EmptyString(local_130,(ulong)local_a8 & 0xffffffff)
                  ;
                  local_f0 = aVar24;
                  duckdb::Bit::BitwiseXor
                            ((Bit *)&local_a8,(string_t *)&local_148.pointer,
                             (string_t *)&local_f0.pointer,psVar12);
                  ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + uVar20))->pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)local_f0;
                }
                uVar21 = uVar21 + 1;
                uVar20 = uVar20 + 0x10;
              } while (pUVar14 + (uVar21 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
              pUVar15 = pUVar14 + uVar21;
            }
          }
          local_100 = local_100 + 1;
          pUVar14 = pUVar15;
        } while ((ulong *)local_100 != local_108);
        return;
      }
    }
    else {
      if (((byte)vVar4 ^ 2) != 0 || vVar5 != (value_type)0x0) {
        if (vVar5 == (value_type)0x0 && vVar4 == (value_type)0x0) {
          lVar23 = *(long *)(vector + 0x20);
          local_118 = *(string_t **)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar18);
          lVar22 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          local_110 = result + 0x28;
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)local_110,(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (pUVar14 != (UnifiedVectorFormat *)0x0) {
              lVar16 = 8;
              do {
                local_a8 = *(string_t **)(lVar23 + -8 + lVar16);
                psVar12 = *(string_t **)(lVar23 + lVar16);
                puVar17 = (undefined8 *)((long)local_118 + -8 + lVar16);
                local_148._0_8_ = *puVar17;
                local_148.pointer.ptr = (char *)puVar17[1];
                local_a0 = psVar12;
                aVar24 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(local_130,(ulong)local_a8 & 0xffffffff);
                local_f0 = aVar24;
                duckdb::Bit::BitwiseXor
                          ((Bit *)&local_a8,(string_t *)&local_148.pointer,
                           (string_t *)&local_f0.pointer,psVar12);
                ((anon_union_16_2_67f50693_for_value *)(lVar22 + -8 + lVar16))->pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)local_f0;
                lVar16 = lVar16 + 0x10;
                local_120 = local_120 + -1;
              } while (local_120 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar14 + 0x3f) {
            local_100 = (ulong)(pUVar14 + 0x3f) >> 6;
            local_f8 = (string_t *)0x0;
            pUVar14 = (UnifiedVectorFormat *)0x0;
            local_128 = lVar22;
            do {
              psVar12 = local_118;
              pVVar1 = local_130;
              if (*(long *)local_110 == 0) {
                uVar19 = 0xffffffffffffffff;
              }
              else {
                uVar19 = *(ulong *)(*(long *)local_110 + (long)local_f8 * 8);
              }
              pUVar10 = pUVar14 + 0x40;
              if (local_120 <= pUVar14 + 0x40) {
                pUVar10 = local_120;
              }
              pUVar15 = pUVar10;
              if (uVar19 != 0) {
                pUVar15 = pUVar14;
                if (uVar19 == 0xffffffffffffffff) {
                  if (pUVar14 < pUVar10) {
                    uVar19 = (long)pUVar14 << 4 | 8;
                    do {
                      local_a8 = *(string_t **)(lVar23 + -8 + uVar19);
                      psVar13 = *(string_t **)(lVar23 + uVar19);
                      puVar17 = (undefined8 *)((long)psVar12 + -8 + uVar19);
                      local_148._0_8_ = *puVar17;
                      local_148.pointer.ptr = (char *)puVar17[1];
                      local_a0 = psVar13;
                      aVar24 = (anon_union_16_2_67f50693_for_value)
                               duckdb::StringVector::EmptyString
                                         (pVVar1,(ulong)local_a8 & 0xffffffff);
                      local_f0 = aVar24;
                      duckdb::Bit::BitwiseXor
                                ((Bit *)&local_a8,(string_t *)&local_148.pointer,
                                 (string_t *)&local_f0.pointer,psVar13);
                      ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + uVar19))->pointer =
                           (anon_struct_16_3_d7536bce_for_pointer)local_f0;
                      pUVar15 = pUVar15 + 1;
                      uVar19 = uVar19 + 0x10;
                    } while (pUVar10 != pUVar15);
                  }
                }
                else if (pUVar14 < pUVar10) {
                  uVar20 = (long)pUVar14 << 4 | 8;
                  uVar21 = 0;
                  do {
                    if ((uVar19 >> (uVar21 & 0x3f) & 1) != 0) {
                      local_a8 = *(string_t **)(lVar23 + -8 + uVar20);
                      psVar12 = *(string_t **)(lVar23 + uVar20);
                      puVar17 = (undefined8 *)((long)local_118 + -8 + uVar20);
                      local_148._0_8_ = *puVar17;
                      local_148.pointer.ptr = (char *)puVar17[1];
                      local_a0 = psVar12;
                      aVar24 = (anon_union_16_2_67f50693_for_value)
                               duckdb::StringVector::EmptyString
                                         (local_130,(ulong)local_a8 & 0xffffffff);
                      local_f0 = aVar24;
                      duckdb::Bit::BitwiseXor
                                ((Bit *)&local_a8,(string_t *)&local_148.pointer,
                                 (string_t *)&local_f0.pointer,psVar12);
                      ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + uVar20))->pointer =
                           (anon_struct_16_3_d7536bce_for_pointer)local_f0;
                    }
                    uVar21 = uVar21 + 1;
                    uVar20 = uVar20 + 0x10;
                  } while (pUVar14 + (uVar21 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
                  pUVar15 = pUVar14 + uVar21;
                }
              }
              local_f8 = (string_t *)((long)local_f8 + 1);
              pUVar14 = pUVar15;
            } while (local_f8 != (string_t *)local_100);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_f0.pointer)
          ;
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_a8);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar14);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar14);
          duckdb::Vector::SetVectorType(VVar18);
          lVar23 = *(long *)(result + 0x20);
          local_128 = (long)local_a0;
          FlatVector::VerifyFlatVector(result);
          if (local_98 == 0 && local_e0 == 0) {
            if (pUVar14 != (UnifiedVectorFormat *)0x0) {
              lVar22 = *(long *)local_f0._0_8_;
              lVar16 = *(long *)local_a8;
              puVar17 = (undefined8 *)(lVar23 + 8);
              pUVar14 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar10 = pUVar14;
                if (lVar22 != 0) {
                  pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar22 + (long)pUVar14 * 4);
                }
                pUVar15 = pUVar14;
                if (lVar16 != 0) {
                  pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar16 + (long)pUVar14 * 4);
                }
                local_60 = *(ulong *)(local_f0.pointer.ptr + (long)pUVar10 * 0x10);
                local_58 = *(undefined8 *)(local_f0.pointer.ptr + (long)pUVar10 * 0x10 + 8);
                psVar12 = (string_t *)((long)pUVar15 * 0x10);
                puVar2 = (undefined8 *)((long)&psVar12->value + local_128);
                local_40._0_8_ = *puVar2;
                local_40.pointer.ptr = (char *)puVar2[1];
                aVar24 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(local_130,local_60 & 0xffffffff);
                local_148 = aVar24;
                duckdb::Bit::BitwiseXor
                          ((Bit *)&local_60,(string_t *)&local_40.pointer,
                           (string_t *)&local_148.pointer,psVar12);
                puVar17[-1] = local_148._0_8_;
                *puVar17 = local_148.pointer.ptr;
                pUVar14 = pUVar14 + 1;
                puVar17 = puVar17 + 2;
              } while (local_120 != pUVar14);
            }
          }
          else if (pUVar14 != (UnifiedVectorFormat *)0x0) {
            lVar22 = *(long *)local_f0._0_8_;
            lVar16 = *(long *)local_a8;
            pVVar1 = local_130 + 0x30;
            puVar17 = (undefined8 *)(lVar23 + 8);
            pUVar14 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar10 = pUVar14;
              if (lVar22 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar22 + (long)pUVar14 * 4);
              }
              pUVar15 = pUVar14;
              if (lVar16 != 0) {
                pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar16 + (long)pUVar14 * 4);
              }
              if (((local_e0 == 0) ||
                  ((*(ulong *)(local_e0 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1)
                   != 0)) &&
                 ((local_98 == 0 ||
                  ((*(ulong *)(local_98 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1)
                   != 0)))) {
                local_60 = *(ulong *)(local_f0.pointer.ptr + (long)pUVar10 * 0x10);
                local_58 = *(undefined8 *)(local_f0.pointer.ptr + (long)pUVar10 * 0x10 + 8);
                psVar12 = (string_t *)((long)pUVar15 * 0x10);
                puVar2 = (undefined8 *)((long)&psVar12->value + local_128);
                local_40._0_8_ = *puVar2;
                local_40.pointer.ptr = (char *)puVar2[1];
                aVar24 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(local_130,local_60 & 0xffffffff);
                local_148 = aVar24;
                duckdb::Bit::BitwiseXor
                          ((Bit *)&local_60,(string_t *)&local_40.pointer,
                           (string_t *)&local_148.pointer,psVar12);
                puVar17[-1] = local_148._0_8_;
                *puVar17 = local_148.pointer.ptr;
              }
              else {
                if (*(long *)(local_130 + 0x28) == 0) {
                  local_60 = *(ulong *)(local_130 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_148.pointer,&local_60);
                  aVar24 = local_148;
                  local_148._0_8_ = 0;
                  local_148.pointer.ptr = (char *)0x0;
                  ((anon_union_16_2_67f50693_for_value *)(local_130 + 0x30))->pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)aVar24;
                  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_130 + 0x38) !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_130 + 0x38))
                    ;
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.pointer.ptr !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.pointer.ptr
                              );
                  }
                  pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)pVVar1);
                  *(unsigned_long **)(local_130 + 0x28) =
                       (pTVar11->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar9 = (byte)pUVar14 & 0x3f;
                puVar3 = (ulong *)(*(long *)(local_130 + 0x28) + ((ulong)pUVar14 >> 6) * 8);
                *puVar3 = *puVar3 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pUVar14 = pUVar14 + 1;
              puVar17 = puVar17 + 2;
            } while (local_120 != pUVar14);
          }
          if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
          }
          if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
          }
        }
        return;
      }
      local_108 = *(ulong **)(vector + 0x20);
      psVar12 = *(string_t **)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        local_118 = psVar12;
        duckdb::Vector::SetVectorType(VVar18);
        local_128 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar14 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          uVar19 = *local_108;
          uVar20 = local_108[1];
          lVar23 = 8;
          do {
            puVar17 = (undefined8 *)((long)local_118 + lVar23 + -8);
            local_148._0_8_ = *puVar17;
            local_148.pointer.ptr = (char *)puVar17[1];
            local_a8 = (string_t *)uVar19;
            local_a0 = (string_t *)uVar20;
            aVar24 = (anon_union_16_2_67f50693_for_value)
                     duckdb::StringVector::EmptyString(local_130,uVar19 & 0xffffffff);
            local_f0 = aVar24;
            duckdb::Bit::BitwiseXor
                      ((Bit *)&local_a8,(string_t *)&local_148.pointer,(string_t *)&local_f0.pointer
                       ,psVar12);
            ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + lVar23))->pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)local_f0;
            lVar23 = lVar23 + 0x10;
            local_120 = local_120 + -1;
          } while (local_120 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar14 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        local_50 = (ulong)(pUVar14 + 0x3f) >> 6;
        local_48 = 0;
        pUVar14 = (UnifiedVectorFormat *)0x0;
        do {
          psVar12 = local_118;
          if (*(long *)(local_130 + 0x28) == 0) {
            uVar19 = 0xffffffffffffffff;
          }
          else {
            uVar19 = *(ulong *)(*(long *)(local_130 + 0x28) + local_48 * 8);
          }
          pUVar10 = pUVar14 + 0x40;
          if (local_120 <= pUVar14 + 0x40) {
            pUVar10 = local_120;
          }
          pUVar15 = pUVar10;
          if (uVar19 != 0) {
            pUVar15 = pUVar14;
            if (uVar19 == 0xffffffffffffffff) {
              if (pUVar14 < pUVar10) {
                psVar12 = (string_t *)*local_108;
                local_110 = (Vector *)local_108[1];
                uVar19 = (long)pUVar14 << 4 | 8;
                local_100 = (ulong)psVar12 & 0xffffffff;
                local_f8 = psVar12;
                do {
                  puVar17 = (undefined8 *)((long)local_118 + (uVar19 - 8));
                  local_148._0_8_ = *puVar17;
                  local_148.pointer.ptr = (char *)puVar17[1];
                  local_a8 = local_f8;
                  local_a0 = (string_t *)local_110;
                  aVar24 = (anon_union_16_2_67f50693_for_value)
                           duckdb::StringVector::EmptyString(local_130,local_100);
                  local_f0 = aVar24;
                  duckdb::Bit::BitwiseXor
                            ((Bit *)&local_a8,(string_t *)&local_148.pointer,
                             (string_t *)&local_f0.pointer,psVar12);
                  ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + uVar19))->pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)local_f0;
                  pUVar14 = pUVar14 + 1;
                  uVar19 = uVar19 + 0x10;
                  pUVar15 = pUVar14;
                } while (pUVar10 != pUVar14);
              }
            }
            else if (pUVar14 < pUVar10) {
              uVar20 = (long)pUVar14 << 4 | 8;
              uVar21 = 0;
              do {
                if ((uVar19 >> (uVar21 & 0x3f) & 1) != 0) {
                  local_a8 = (string_t *)*local_108;
                  psVar13 = (string_t *)local_108[1];
                  puVar17 = (undefined8 *)((long)psVar12 + (uVar20 - 8));
                  local_148._0_8_ = *puVar17;
                  local_148.pointer.ptr = (char *)puVar17[1];
                  local_a0 = psVar13;
                  aVar24 = (anon_union_16_2_67f50693_for_value)
                           duckdb::StringVector::EmptyString(local_130,(ulong)local_a8 & 0xffffffff)
                  ;
                  local_f0 = aVar24;
                  duckdb::Bit::BitwiseXor
                            ((Bit *)&local_a8,(string_t *)&local_148.pointer,
                             (string_t *)&local_f0.pointer,psVar13);
                  ((anon_union_16_2_67f50693_for_value *)(local_128 + -8 + uVar20))->pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)local_f0;
                }
                uVar21 = uVar21 + 1;
                uVar20 = uVar20 + 0x10;
              } while (pUVar14 + (uVar21 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
              pUVar15 = pUVar14 + uVar21;
            }
          }
          local_48 = local_48 + 1;
          pUVar14 = pUVar15;
        } while (local_48 != local_50);
        return;
      }
    }
    duckdb::Vector::SetVectorType(VVar18);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitwiseXOROperation(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t rhs, string_t lhs) {
		    string_t target = StringVector::EmptyString(result, rhs.GetSize());

		    Bit::BitwiseXor(rhs, lhs, target);
		    return target;
	    });
}